

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.cpp
# Opt level: O0

convertable * __thiscall
mpt::node_relation::find(node_relation *this,type_t type,char *name,int nlen)

{
  convertable *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  node_relation *local_58;
  uint local_50;
  metatype *m;
  node *c;
  int nlen_local;
  char *name_local;
  type_t type_local;
  node_relation *this_local;
  
  if (this->_curr == (node *)0x0) {
    this_local = (node_relation *)0x0;
  }
  else {
    c._4_4_ = nlen;
    if (nlen < 0) {
      if (name == (char *)0x0) {
        local_50 = 0;
      }
      else {
        sVar4 = strlen(name);
        local_50 = (uint)sVar4;
      }
      c._4_4_ = local_50;
    }
    for (m = (metatype *)this->_curr->children; m != (metatype *)0x0;
        m = (metatype *)m[1].super_convertable._vptr_convertable) {
      pcVar1 = (convertable *)(m->super_convertable)._vptr_convertable;
      if ((pcVar1 != (convertable *)0x0) &&
         ((name == (char *)0x0 ||
          (bVar2 = identifier::equal((identifier *)(m + 5),name,c._4_4_), bVar2)))) {
        if (type == 0) {
          return pcVar1;
        }
        iVar3 = (**pcVar1->_vptr_convertable)(pcVar1,type,0);
        if (-1 < iVar3) {
          return pcVar1;
        }
      }
    }
    if (this->_parent == (relation *)0x0) {
      local_58 = (node_relation *)0x0;
    }
    else {
      iVar3 = (**this->_parent->_vptr_relation)(this->_parent,type,name,(ulong)c._4_4_);
      local_58 = (node_relation *)CONCAT44(extraout_var,iVar3);
    }
    this_local = local_58;
  }
  return (convertable *)this_local;
}

Assistant:

convertable *node_relation::find(type_t type, const char *name, int nlen) const
{
	if (!_curr) {
		return 0;
	}
	if (nlen < 0) nlen = name ? strlen(name) : 0;

	for (const node *c = _curr->children; c; c = c->next) {
		metatype *m;
		if (!(m = c->_meta)) {
			continue;
		}
		if (name && !c->ident.equal(name, nlen)) {
			continue;
		}
		// optional type restriction
		if (type && m->convert(type, 0) < 0) {
			continue;
		}
		return m;
	}
	return _parent ? _parent->find(type, name, nlen) : 0;
}